

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcpr(fitsfile *infptr,fitsfile *outfptr,int cpopt,HDUtracker *HDU,int *status)

{
  int iVar1;
  bool bVar2;
  fitsfile *local_230;
  fitsfile *mfptr;
  char *excludeList [8];
  char *includeList [1];
  char *tkeyvalue;
  char comment [81];
  char local_178 [8];
  char card [81];
  char local_118 [8];
  char keyvalue [71];
  char local_c8 [8];
  char keyword [75];
  long local_70;
  long newTfields;
  long tfields;
  long nmembers;
  int newPosition;
  int startSearch;
  int keypos;
  int numkeys;
  int groupHDUnum;
  int hdutype;
  int nexclude;
  int i;
  int *status_local;
  HDUtracker *HDU_local;
  fitsfile *pfStack_20;
  int cpopt_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  groupHDUnum = 8;
  numkeys = 0;
  keypos = 0;
  startSearch = 0;
  newPosition = 0;
  nmembers._4_4_ = 0;
  nmembers._0_4_ = 0;
  tfields = 0;
  newTfields = 0;
  local_70 = 0;
  excludeList[7] = "*";
  _nexclude = status;
  status_local = &HDU->nHDU;
  HDU_local._4_4_ = cpopt;
  pfStack_20 = outfptr;
  outfptr_local = infptr;
  memcpy(&mfptr,&PTR_anon_var_dwarf_1396_002b75e0,0x40);
  local_230 = (fitsfile *)0x0;
  if (*_nexclude != 0) {
    return *_nexclude;
  }
  iVar1 = ffgtnm(outfptr_local,&tfields,_nexclude);
  *_nexclude = iVar1;
  iVar1 = ffgkys(outfptr_local,"GRPNAME",local_118,local_178,_nexclude);
  *_nexclude = iVar1;
  if (*_nexclude == 0xca) {
    local_118[0] = '\0';
    *_nexclude = 0;
  }
  prepare_keyvalue(local_118);
  iVar1 = ffgtcr(pfStack_20,local_118,0,_nexclude);
  *_nexclude = iVar1;
  ffghdn(pfStack_20,&keypos);
  iVar1 = fftsud(outfptr_local,(HDUtracker *)status_local,keypos,(char *)0x0);
  *_nexclude = iVar1;
  if (HDU_local._4_4_ == 0) {
    hdutype = 1;
    while( true ) {
      bVar2 = false;
      if (hdutype <= tfields) {
        bVar2 = *_nexclude == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop(outfptr_local,(long)hdutype,&local_230,_nexclude);
      *_nexclude = iVar1;
      iVar1 = ffgtam(pfStack_20,local_230,0,_nexclude);
      *_nexclude = iVar1;
      ffclos(local_230,_nexclude);
      local_230 = (fitsfile *)0x0;
      hdutype = hdutype + 1;
    }
  }
  else if (HDU_local._4_4_ == 2) {
    hdutype = 1;
    while( true ) {
      bVar2 = false;
      if (hdutype <= tfields) {
        bVar2 = *_nexclude == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop(outfptr_local,(long)hdutype,&local_230,_nexclude);
      *_nexclude = iVar1;
      if (*_nexclude == 0) {
        iVar1 = fftsad(local_230,(HDUtracker *)status_local,(int *)&nmembers,(char *)0x0);
        *_nexclude = iVar1;
        if (*_nexclude == 0x15a) {
          *_nexclude = 0;
          iVar1 = ffgtam(pfStack_20,(fitsfile *)0x0,(int)nmembers,_nexclude);
          *_nexclude = iVar1;
          ffclos(local_230,_nexclude);
          local_230 = (fitsfile *)0x0;
        }
        else if (*_nexclude == 0) {
          iVar1 = ffgkys(local_230,"EXTNAME",local_118,local_178,_nexclude);
          *_nexclude = iVar1;
          if (*_nexclude == 0xca) {
            local_118[0] = '\0';
            *_nexclude = 0;
          }
          prepare_keyvalue(local_118);
          iVar1 = fits_strcasecmp(local_118,"GROUPING");
          if (iVar1 == 0) {
            iVar1 = ffgtcpr(local_230,pfStack_20,2,(HDUtracker *)status_local,_nexclude);
            *_nexclude = iVar1;
          }
          else {
            iVar1 = ffgmcp(outfptr_local,pfStack_20,(long)hdutype,1,_nexclude);
            *_nexclude = iVar1;
          }
          ffghdn(pfStack_20,(int *)&nmembers);
          iVar1 = fits_strcasecmp(local_118,"GROUPING");
          if (iVar1 != 0) {
            iVar1 = fftsud(local_230,(HDUtracker *)status_local,(int)nmembers,(char *)0x0);
            *_nexclude = iVar1;
          }
          iVar1 = ffmahd(pfStack_20,keypos,&numkeys,_nexclude);
          *_nexclude = iVar1;
          iVar1 = ffgtam(pfStack_20,(fitsfile *)0x0,(int)nmembers,_nexclude);
          *_nexclude = iVar1;
          ffclos(local_230,_nexclude);
          local_230 = (fitsfile *)0x0;
        }
      }
      hdutype = hdutype + 1;
    }
  }
  else {
    *_nexclude = 0x15b;
    ffpmsg("Invalid value specified for cmopt parameter (ffgtcpr)");
  }
  if (*_nexclude == 0) {
    ffmahd(pfStack_20,keypos,&numkeys,_nexclude);
    iVar1 = ffgcrd(pfStack_20,"TTYPE1",local_178,_nexclude);
    *_nexclude = iVar1;
    iVar1 = ffghps(pfStack_20,&startSearch,&newPosition,_nexclude);
    *_nexclude = iVar1;
    newPosition = newPosition + -1;
    nmembers._4_4_ = 8;
    while (*_nexclude == 0) {
      ffgrec(outfptr_local,nmembers._4_4_,local_178,_nexclude);
      iVar1 = ffgnxk(outfptr_local,excludeList + 7,1,(char **)&mfptr,groupHDUnum,local_178,_nexclude
                    );
      *_nexclude = iVar1;
      iVar1 = ffghps(outfptr_local,&startSearch,(int *)((long)&nmembers + 4),_nexclude);
      *_nexclude = iVar1;
      nmembers._4_4_ = nmembers._4_4_ + -1;
      iVar1 = strncmp(local_178,"GRPLC",5);
      if (iVar1 == 0) {
        iVar1 = ffgrec(outfptr_local,nmembers._4_4_,local_178,_nexclude);
        *_nexclude = iVar1;
        card[1] = '\0';
        iVar1 = ffgkls(outfptr_local,local_178,includeList,(char *)&tkeyvalue,_nexclude);
        *_nexclude = iVar1;
        if (*_nexclude == 0) {
          ffikls(pfStack_20,local_178,includeList[0],(char *)&tkeyvalue,_nexclude);
          ffplsw(pfStack_20,_nexclude);
          free(includeList[0]);
        }
      }
      else {
        iVar1 = ffirec(pfStack_20,newPosition,local_178,_nexclude);
        *_nexclude = iVar1;
      }
      newPosition = newPosition + 1;
    }
    if (*_nexclude == 0xca) {
      *_nexclude = 0;
    }
    else if (*_nexclude != 0) goto LAB_00210e5f;
    iVar1 = ffgkyj(outfptr_local,"TFIELDS",&newTfields,local_178,_nexclude);
    *_nexclude = iVar1;
    iVar1 = ffgkyj(pfStack_20,"TFIELDS",&local_70,local_178,_nexclude);
    *_nexclude = iVar1;
    for (hdutype = 1; hdutype <= newTfields; hdutype = hdutype + 1) {
      snprintf(local_c8,0x4b,"TTYPE%d",(ulong)(uint)hdutype);
      iVar1 = ffgkys(outfptr_local,local_c8,local_118,local_178,_nexclude);
      *_nexclude = iVar1;
      if (*_nexclude == 0xca) {
        *_nexclude = 0;
        local_118[0] = '\0';
      }
      prepare_keyvalue(local_118);
      iVar1 = fits_strcasecmp(local_118,"MEMBER_XTENSION");
      if ((((iVar1 != 0) && (iVar1 = fits_strcasecmp(local_118,"MEMBER_NAME"), iVar1 != 0)) &&
          (iVar1 = fits_strcasecmp(local_118,"MEMBER_VERSION"), iVar1 != 0)) &&
         (((iVar1 = fits_strcasecmp(local_118,"MEMBER_POSITION"), iVar1 != 0 &&
           (iVar1 = fits_strcasecmp(local_118,"MEMBER_LOCATION"), iVar1 != 0)) &&
          (iVar1 = fits_strcasecmp(local_118,"MEMBER_URI_TYPE"), iVar1 != 0)))) {
        iVar1 = ffcpcl(outfptr_local,pfStack_20,hdutype,(int)local_70 + 1,1,_nexclude);
        *_nexclude = iVar1;
        local_70 = local_70 + 1;
      }
    }
  }
LAB_00210e5f:
  if (local_230 != (fitsfile *)0x0) {
    ffclos(local_230,_nexclude);
  }
  return *_nexclude;
}

Assistant:

int ffgtcpr(fitsfile   *infptr,  /* input FITS file pointer                 */
	    fitsfile   *outfptr, /* output FITS file pointer                */
	    int         cpopt,   /* code specifying copy options:
				    OPT_GCP_GPT (0) ==> cp only grouping table
				    OPT_GCP_ALL (2) ==> recusrively copy 
				    members and their members (if groups)   */
	    HDUtracker *HDU,     /* list of already copied HDUs             */
	    int        *status)  /* return status code                      */

/*
  copy a Group to a new FITS file. If the cpopt parameter is set to 
  OPT_GCP_GPT (copy grouping table only) then the existing members have their 
  GRPIDn and GRPLCn keywords updated to reflect the existance of the new group,
  since they now belong to another group. If cpopt is set to OPT_GCP_ALL 
  (copy grouping table and members recursively) then the original members are 
  not updated; the new grouping table is modified to include only the copied 
  member HDUs and not the original members.

  Note that this function is recursive. When copt is OPT_GCP_ALL it will call
  itself whenever a member HDU of the current grouping table is itself a
  grouping table (i.e., EXTNAME = 'GROUPING').
*/

{

  int i;
  int nexclude     = 8;
  int hdutype      = 0;
  int groupHDUnum  = 0;
  int numkeys      = 0;
  int keypos       = 0;
  int startSearch  = 0;
  int newPosition  = 0;

  long nmembers    = 0;
  long tfields     = 0;
  long newTfields  = 0;

  char keyword[FLEN_KEYWORD];
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char comment[FLEN_CARD];
  char *tkeyvalue;

  char *includeList[] = {"*"};
  char *excludeList[] = {"EXTNAME","EXTVER","GRPNAME","GRPID#","GRPLC#",
			 "THEAP","TDIM#","T????#"};

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	create a new grouping table in the FITS file pointed to by outptr
      */

      *status = fits_get_num_members(infptr,&nmembers,status);

      *status = fits_read_key_str(infptr,"GRPNAME",keyvalue,card,status);

      if(*status == KEY_NO_EXIST)
	{
	  keyvalue[0] = 0;
	  *status     = 0;
	}
      prepare_keyvalue(keyvalue);

      *status = fits_create_group(outfptr,keyvalue,GT_ID_ALL_URI,status);
     
      /* save the new grouping table's HDU position for future use */

      fits_get_hdu_num(outfptr,&groupHDUnum);

      /* update the HDUtracker struct with the grouping table's new position */
      
      *status = fftsud(infptr,HDU,groupHDUnum,NULL);

      /*
	Now populate the copied grouping table depending upon the 
	copy option parameter value
      */

      switch(cpopt)
	{

	  /*
	    for the "copy grouping table only" option we only have to
	    add the members of the original grouping table to the new
	    grouping table
	  */

	case OPT_GCP_GPT:

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      *status = fits_open_member(infptr,i,&mfptr,status);
	      *status = fits_add_group_member(outfptr,mfptr,0,status);

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	case OPT_GCP_ALL:
      
	  /*
	    for the "copy the entire group" option
 	  */

	  /* loop over all the grouping table members */

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      /* open the ith member */

	      *status = fits_open_member(infptr,i,&mfptr,status);

	      if(*status != 0) continue;

	      /* add it to the HDUtracker struct */

	      *status = fftsad(mfptr,HDU,&newPosition,NULL);

	      /* if already copied then just add the member to the group */

	      if(*status == HDU_ALREADY_TRACKED)
		{
		  *status = 0;
		  *status = fits_add_group_member(outfptr,NULL,newPosition,
						  status);
		  fits_close_file(mfptr,status);
                  mfptr = NULL;
		  continue;
		}
	      else if(*status != 0) continue;

	      /* see if the member is a grouping table */

	      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,
					  status);

	      if(*status == KEY_NO_EXIST)
		{
		  keyvalue[0] = 0;
		  *status     = 0;
		}
	      prepare_keyvalue(keyvalue);

	      /*
		if the member is a grouping table then copy it and all of
		its members using ffgtcpr(), else copy it using
		fits_copy_member(); the outptr will point to the newly
		copied member upon return from both functions
	      */

	      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
		*status = ffgtcpr(mfptr,outfptr,OPT_GCP_ALL,HDU,status);
	      else
		*status = fits_copy_member(infptr,outfptr,i,OPT_MCP_NADD,
					   status);

	      /* retrieve the position of the newly copied member */

	      fits_get_hdu_num(outfptr,&newPosition);

	      /* update the HDUtracker struct with member's new position */
	      
	      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
		*status = fftsud(mfptr,HDU,newPosition,NULL);

	      /* move the outfptr back to the copied grouping table HDU */

	      *status = fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

	      /* add the copied member HDU to the copied grouping table */

	      *status = fits_add_group_member(outfptr,NULL,newPosition,status);

	      /* close the mfptr pointer */

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	default:
	  
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for cmopt parameter (ffgtcpr)");
	  break;
	}

      if(*status != 0) continue; 

      /* 
	 reposition the outfptr to the grouping table so that the grouping
	 table is the CHDU upon return to the calling function
      */

      fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

      /*
	 copy all auxiliary keyword records from the original grouping table
	 to the new grouping table; they are copied in their original order
	 and inserted just before the TTYPE1 keyword record
      */

      *status = fits_read_card(outfptr,"TTYPE1",card,status);
      *status = fits_get_hdrpos(outfptr,&numkeys,&keypos,status);
      --keypos;

      startSearch = 8;

      while(*status == 0)
	{
	  ffgrec(infptr,startSearch,card,status);

	  *status = fits_find_nextkey(infptr,includeList,1,excludeList,
				      nexclude,card,status);

	  *status = fits_get_hdrpos(infptr,&numkeys,&startSearch,status);

	  --startSearch;
	  /* SPR 1738 */
	  if (strncmp(card,"GRPLC",5)) {
	    /* Not going to be a long string so we're ok */
	    *status = fits_insert_record(outfptr,keypos,card,status);
	  } else {
	    /* We could have a long string */
	    *status = fits_read_record(infptr,startSearch,card,status);
	    card[9] = '\0';
	    *status = fits_read_key_longstr(infptr,card,&tkeyvalue,comment,
					    status);
	    if (0 == *status) {
	      fits_insert_key_longstr(outfptr,card,tkeyvalue,comment,status);
	      fits_write_key_longwarn(outfptr,status);
	      free(tkeyvalue);
	    }
	  }
	  
	  ++keypos;
	}
      
	  
      if(*status == KEY_NO_EXIST) 
	*status = 0;
      else if(*status != 0) continue;

      /*
	 search all the columns of the original grouping table and copy
	 those to the new grouping table that were not part of the grouping
	 convention. Note that is legal to have additional columns in a
	 grouping table. Also note that the order of the columns may
	 not be the same in the original and copied grouping table.
      */

      /* retrieve the number of columns in the original and new group tables */

      *status = fits_read_key_lng(infptr,"TFIELDS",&tfields,card,status);
      *status = fits_read_key_lng(outfptr,"TFIELDS",&newTfields,card,status);

      for(i = 1; i <= tfields; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"TTYPE%d",i);
	  *status = fits_read_key_str(infptr,keyword,keyvalue,card,status);
	  
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
              keyvalue[0] = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  if(fits_strcasecmp(keyvalue,"MEMBER_XTENSION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_NAME")     != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_VERSION")  != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_POSITION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_LOCATION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_URI_TYPE") != 0   )
	    {
 
	      /* SPR 3956, add at the end of the table */
	      *status = fits_copy_col(infptr,outfptr,i,newTfields+1,1,status);
	      ++newTfields;
	    }
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}